

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

pthread_key_t
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::CreateKey(void)

{
  pthread_key_t in_EAX;
  int iVar1;
  pthread_key_t local_18;
  GTestLog local_14;
  pthread_key_t key;
  
  local_18 = in_EAX;
  iVar1 = pthread_key_create(&local_18,DeleteThreadLocalValue);
  if (iVar1 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/gtest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x892);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_key_create(&key, &DeleteThreadLocalValue)",0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar1);
    GTestLog::~GTestLog(&local_14);
  }
  return local_18;
}

Assistant:

static pthread_key_t CreateKey() {
    pthread_key_t key;
    // When a thread exits, DeleteThreadLocalValue() will be called on
    // the object managed for that thread.
    GTEST_CHECK_POSIX_SUCCESS_(
        pthread_key_create(&key, &DeleteThreadLocalValue));
    return key;
  }